

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O3

int32_t __thiscall
icu_63::RuleBasedNumberFormat::getNumberOfRuleSetNames(RuleBasedNumberFormat *this)

{
  int iVar1;
  NFRuleSet **ppNVar2;
  NFRuleSet *pNVar3;
  
  if (this->localizations != (LocalizationInfo *)0x0) {
    iVar1 = (*this->localizations->_vptr_LocalizationInfo[3])();
    return iVar1;
  }
  ppNVar2 = this->fRuleSets;
  iVar1 = 0;
  if ((ppNVar2 != (NFRuleSet **)0x0) && (pNVar3 = *ppNVar2, iVar1 = 0, pNVar3 != (NFRuleSet *)0x0))
  {
    iVar1 = 0;
    do {
      ppNVar2 = ppNVar2 + 1;
      iVar1 = (iVar1 + 1) - (uint)(pNVar3->fIsPublic == '\0');
      pNVar3 = *ppNVar2;
    } while (pNVar3 != (NFRuleSet *)0x0);
  }
  return iVar1;
}

Assistant:

int32_t
RuleBasedNumberFormat::getNumberOfRuleSetNames() const
{
    int32_t result = 0;
    if (localizations) {
        result = localizations->getNumberOfRuleSets();
    }
    else if (fRuleSets) {
        for (NFRuleSet** p = fRuleSets; *p; ++p) {
            if ((**p).isPublic()) {
                ++result;
            }
        }
    }
    return result;
}